

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O2

int ranges::detail::
    variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,0ul>>,ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,1ul>>,ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,2ul>>>,true>::type_const,ranges::detail::get_fn<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>const,2ul>,ranges::detail::indexed_element_fn>
              (long n,indexed_element<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_0UL>
                      self,undefined8 fun)

{
  int iVar1;
  undefined8 local_8;
  
  local_8 = fun;
  if (n != 0) {
    iVar1 = variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,1ul>>,ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,2ul>>>,true>::type_const,ranges::detail::get_fn<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>const,2ul>,ranges::detail::indexed_element_fn>
                      (n + -1);
    return iVar1;
  }
  get_fn<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>const,2ul>
  ::operator()((get_fn<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>const,2ul>
                *)&local_8,self);
}

Assistant:

constexpr int variant_visit_(std::size_t n, Data & self, Fun fun, Proj proj = {})
        {
            return 0 == n ? ((void)invoke(fun, invoke(proj, self.head)), 0)
                          : detail::variant_visit_(
                                n - 1, self.tail, detail::move(fun), detail::move(proj));
        }